

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int inter_block_yrd(AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,BLOCK_SIZE bsize,
                   int64_t ref_best_rd,FAST_TX_SEARCH_MODE ftxs_mode)

{
  uint mi_width_00;
  uint mi_height_00;
  int iVar1;
  int iVar2;
  int iVar3;
  MACROBLOCKD *xd_00;
  long lVar4;
  byte in_CL;
  RD_STATS *in_RDX;
  long in_RSI;
  RD_STATS *in_RDI;
  ENTROPY_CONTEXT *in_R8;
  undefined1 in_R9B;
  uint uVar5;
  int is_cost_valid;
  int64_t skip_txfm_rd;
  int skip_txfm_rate;
  int no_skip_txfm_rate;
  int skip_ctx;
  RD_STATS pn_rd_stats;
  int idx;
  int block;
  int idy;
  int64_t this_rd;
  TXFM_CONTEXT tx_left [32];
  TXFM_CONTEXT tx_above [32];
  ENTROPY_CONTEXT ctxl [32];
  ENTROPY_CONTEXT ctxa [32];
  int init_depth;
  int step;
  int bw;
  int bh;
  TX_SIZE max_tx_size;
  int mi_height;
  int mi_width;
  macroblockd_plane *pd;
  TxfmSearchParams *txfm_params;
  MACROBLOCKD *xd;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  int iVar6;
  undefined4 in_stack_fffffffffffffe44;
  MACROBLOCKD *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  BLOCK_SIZE plane_bsize;
  long local_180;
  RD_STATS local_158;
  int local_12c;
  int local_128;
  int local_124;
  long local_120;
  undefined1 local_118 [32];
  undefined1 local_f8 [59];
  TX_SIZE in_stack_ffffffffffffff43;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  MACROBLOCK *in_stack_ffffffffffffff50;
  AV1_COMP *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  FAST_TX_SEARCH_MODE in_stack_ffffffffffffffd0;
  uint local_2c;
  
  plane_bsize = (BLOCK_SIZE)((ulong)in_stack_fffffffffffffe50 >> 0x38);
  if ((long)in_R8 < 0) {
    av1_invalid_rd_stats(in_RDX);
    local_2c = 0;
  }
  else {
    av1_init_rd_stats(in_RDX);
    xd_00 = (MACROBLOCKD *)(in_RSI + 0x1a0);
    lVar4 = in_RSI + 0x24dcc;
    mi_width_00 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                        [in_CL];
    mi_height_00 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [in_CL];
    iVar1 = get_vartx_max_txsize
                      (in_stack_fffffffffffffe48,
                       (BLOCK_SIZE)((uint)in_stack_fffffffffffffe44 >> 0x18),
                       in_stack_fffffffffffffe40);
    iVar3 = tx_size_high_unit[(byte)iVar1];
    iVar1 = tx_size_wide_unit[(byte)iVar1];
    iVar2 = get_search_init_depth
                      (mi_width_00,mi_height_00,1,(SPEED_FEATURES *)&in_RDI[0x269e].rdcost,
                       (uint)*(byte *)(lVar4 + 0x18));
    av1_get_entropy_contexts
              (plane_bsize,(macroblockd_plane *)in_stack_fffffffffffffe48,
               (ENTROPY_CONTEXT *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (ENTROPY_CONTEXT *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    memcpy(local_f8,xd_00->above_txfm_context,(long)(int)mi_width_00);
    memcpy(local_118,xd_00->left_txfm_context,(long)(int)mi_height_00);
    local_120 = 0;
    local_128 = 0;
    for (local_124 = 0; local_124 < (int)mi_height_00; local_124 = iVar3 + local_124) {
      for (local_12c = 0; local_12c < (int)mi_width_00; local_12c = iVar1 + local_12c) {
        av1_init_rd_stats(&local_158);
        uVar5 = (uint)in_CL;
        iVar6 = iVar2;
        tx_block_yrd(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                     in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff43,
                     (BLOCK_SIZE)lVar4,(int)xd_00,
                     (ENTROPY_CONTEXT *)CONCAT17(in_R9B,in_stack_ffffffffffffffa0),in_R8,
                     (TXFM_CONTEXT *)CONCAT17(in_CL,in_stack_ffffffffffffffb0),
                     (TXFM_CONTEXT *)in_RDX,in_RSI,in_RDI,in_stack_ffffffffffffffd0);
        if (local_158.rate == 0x7fffffff) {
          av1_invalid_rd_stats(in_RDX);
          return 0;
        }
        av1_merge_rd_stats((RD_STATS *)CONCAT44(in_stack_fffffffffffffe44,iVar6),
                           (RD_STATS *)CONCAT44(in_stack_fffffffffffffe3c,uVar5));
        if (((long)local_158.rate * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
            local_158.dist * 0x80 <
            ((long)local_158.zero_rate * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
            local_158.sse * 0x80) {
          local_180 = ((long)local_158.rate * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
                      local_158.dist * 0x80;
        }
        else {
          local_180 = ((long)local_158.zero_rate * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
                      local_158.sse * 0x80;
        }
        local_120 = local_180 + local_120;
        local_128 = iVar1 * iVar3 + local_128;
      }
    }
    iVar3 = av1_get_skip_txfm_context(xd_00);
    lVar4 = ((long)*(int *)(in_RSI + 0x8c84 + (long)iVar3 * 8) * (long)*(int *)(in_RSI + 0x4218) +
             0x100 >> 9) + in_RDX->sse * 0x80;
    local_120 = ((long)(in_RDX->rate + *(int *)(in_RSI + 0x8c80 + (long)iVar3 * 8)) *
                 (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) + in_RDX->dist * 0x80;
    if (lVar4 < local_120) {
      in_RDX->rate = 0;
      in_RDX->dist = in_RDX->sse;
      in_RDX->skip_txfm = '\x01';
      local_120 = lVar4;
    }
    local_2c = (uint)((long)in_R8 < local_120);
    if (local_2c == 0) {
      av1_invalid_rd_stats(in_RDX);
    }
  }
  return local_2c;
}

Assistant:

static int inter_block_yrd(const AV1_COMP *cpi, MACROBLOCK *x,
                           RD_STATS *rd_stats, BLOCK_SIZE bsize,
                           int64_t ref_best_rd, FAST_TX_SEARCH_MODE ftxs_mode) {
  if (ref_best_rd < 0) {
    av1_invalid_rd_stats(rd_stats);
    return 0;
  }

  av1_init_rd_stats(rd_stats);

  MACROBLOCKD *const xd = &x->e_mbd;
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const struct macroblockd_plane *const pd = &xd->plane[0];
  const int mi_width = mi_size_wide[bsize];
  const int mi_height = mi_size_high[bsize];
  const TX_SIZE max_tx_size = get_vartx_max_txsize(xd, bsize, 0);
  const int bh = tx_size_high_unit[max_tx_size];
  const int bw = tx_size_wide_unit[max_tx_size];
  const int step = bw * bh;
  const int init_depth = get_search_init_depth(
      mi_width, mi_height, 1, &cpi->sf, txfm_params->tx_size_search_method);
  ENTROPY_CONTEXT ctxa[MAX_MIB_SIZE];
  ENTROPY_CONTEXT ctxl[MAX_MIB_SIZE];
  TXFM_CONTEXT tx_above[MAX_MIB_SIZE];
  TXFM_CONTEXT tx_left[MAX_MIB_SIZE];
  av1_get_entropy_contexts(bsize, pd, ctxa, ctxl);
  memcpy(tx_above, xd->above_txfm_context, sizeof(TXFM_CONTEXT) * mi_width);
  memcpy(tx_left, xd->left_txfm_context, sizeof(TXFM_CONTEXT) * mi_height);

  int64_t this_rd = 0;
  for (int idy = 0, block = 0; idy < mi_height; idy += bh) {
    for (int idx = 0; idx < mi_width; idx += bw) {
      RD_STATS pn_rd_stats;
      av1_init_rd_stats(&pn_rd_stats);
      tx_block_yrd(cpi, x, idy, idx, block, max_tx_size, bsize, init_depth,
                   ctxa, ctxl, tx_above, tx_left, ref_best_rd - this_rd,
                   &pn_rd_stats, ftxs_mode);
      if (pn_rd_stats.rate == INT_MAX) {
        av1_invalid_rd_stats(rd_stats);
        return 0;
      }
      av1_merge_rd_stats(rd_stats, &pn_rd_stats);
      this_rd +=
          AOMMIN(RDCOST(x->rdmult, pn_rd_stats.rate, pn_rd_stats.dist),
                 RDCOST(x->rdmult, pn_rd_stats.zero_rate, pn_rd_stats.sse));
      block += step;
    }
  }

  const int skip_ctx = av1_get_skip_txfm_context(xd);
  const int no_skip_txfm_rate = x->mode_costs.skip_txfm_cost[skip_ctx][0];
  const int skip_txfm_rate = x->mode_costs.skip_txfm_cost[skip_ctx][1];
  const int64_t skip_txfm_rd = RDCOST(x->rdmult, skip_txfm_rate, rd_stats->sse);
  this_rd =
      RDCOST(x->rdmult, rd_stats->rate + no_skip_txfm_rate, rd_stats->dist);
  if (skip_txfm_rd < this_rd) {
    this_rd = skip_txfm_rd;
    rd_stats->rate = 0;
    rd_stats->dist = rd_stats->sse;
    rd_stats->skip_txfm = 1;
  }

  const int is_cost_valid = this_rd > ref_best_rd;
  if (!is_cost_valid) {
    // reset cost value
    av1_invalid_rd_stats(rd_stats);
  }
  return is_cost_valid;
}